

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall cmTarget::SetProperty(cmTarget *this,string *prop,char *value)

{
  pointer *pppTVar1;
  cmMakefile *pcVar2;
  iterator iVar3;
  cmTargetInternals *pcVar4;
  pointer ppTVar5;
  _Alloc_hider _Var6;
  bool bVar7;
  int iVar8;
  ostream *poVar9;
  cmCompiledGeneratorExpression *x;
  auto_ptr<cmCompiledGeneratorExpression> *this_00;
  vector<cmListFileContext,_std::allocator<cmListFileContext>_> *this_01;
  cmGeneratorExpression ge;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  ostringstream e;
  cmGeneratorExpression local_210;
  undefined1 local_208 [16];
  undefined1 local_1f8 [32];
  string local_1d8;
  auto_ptr<cmCompiledGeneratorExpression> local_1b8;
  auto_ptr<cmCompiledGeneratorExpression> local_1b0;
  auto_ptr<cmCompiledGeneratorExpression> local_1a8;
  auto_ptr<cmCompiledGeneratorExpression> local_1a0;
  auto_ptr<cmCompiledGeneratorExpression> local_198;
  undefined1 local_190 [376];
  
  if ((this->TargetTypeValue == INTERFACE_LIBRARY) &&
     (bVar7 = whiteListedInterfaceProperty(prop), !bVar7)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "INTERFACE_LIBRARY targets may only have whitelisted properties.  The property \"",
               0x4f);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_190,(prop->_M_dataplus)._M_p,prop->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" is not allowed.",0x11);
    pcVar2 = this->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_208);
LAB_0035bfec:
    if ((cmListFileBacktrace *)local_208._0_8_ != (cmListFileBacktrace *)local_1f8) {
      operator_delete((void *)local_208._0_8_,local_1f8._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
    std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
    return;
  }
  iVar8 = std::__cxx11::string::compare((char *)prop);
  if (iVar8 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"NAME property is read-only\n",0x1b);
    pcVar2 = this->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_208);
    goto LAB_0035bfec;
  }
  iVar8 = std::__cxx11::string::compare((char *)prop);
  if (iVar8 == 0) {
    cmMakefile::GetBacktrace((cmListFileBacktrace *)local_190,this->Makefile);
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)local_208,(cmListFileBacktrace *)local_190);
    pcVar4 = (this->Internal).Pointer;
    std::
    for_each<__gnu_cxx::__normal_iterator<cmTargetInternals::TargetPropertyEntry*const*,std::vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>>,ContainerAlgorithms::DefaultDeleter<std::vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>,false>>
              ((pcVar4->IncludeDirectoriesEntries).
               super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (pcVar4->IncludeDirectoriesEntries).
               super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    ppTVar5 = (pcVar4->IncludeDirectoriesEntries).
              super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((pcVar4->IncludeDirectoriesEntries).
        super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppTVar5) {
      (pcVar4->IncludeDirectoriesEntries).
      super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppTVar5;
    }
    cmGeneratorExpression::Parse(&local_210,local_208);
    local_1d8._M_dataplus._M_p = (pointer)local_210.Backtrace;
    local_210.Backtrace = (cmListFileBacktrace *)0x0;
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)&local_210);
    pcVar4 = (this->Internal).Pointer;
    local_210.Backtrace = (cmListFileBacktrace *)operator_new(0x10);
    _Var6._M_p = local_1d8._M_dataplus._M_p;
    local_1d8._M_dataplus._M_p = (pointer)0x0;
    local_198.x_ = (cmCompiledGeneratorExpression *)0x0;
    (((cmCompiledGeneratorExpression *)local_210.Backtrace)->Backtrace).
    super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
    super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)_Var6._M_p;
    (((cmCompiledGeneratorExpression *)local_210.Backtrace)->Backtrace).
    super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
    super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)&cmTargetInternals::TargetPropertyEntry::NoLinkImplItem;
    iVar3._M_current =
         (pcVar4->IncludeDirectoriesEntries).
         super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (pcVar4->IncludeDirectoriesEntries).
        super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
      ::_M_realloc_insert<cmTargetInternals::TargetPropertyEntry*>
                ((vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
                  *)&pcVar4->IncludeDirectoriesEntries,iVar3,(TargetPropertyEntry **)&local_210);
    }
    else {
      *iVar3._M_current = (TargetPropertyEntry *)local_210.Backtrace;
      pppTVar1 = &(pcVar4->IncludeDirectoriesEntries).
                  super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar1 = *pppTVar1 + 1;
    }
    this_00 = &local_198;
  }
  else {
    iVar8 = std::__cxx11::string::compare((char *)prop);
    if (iVar8 == 0) {
      cmMakefile::GetBacktrace((cmListFileBacktrace *)local_190,this->Makefile);
      cmGeneratorExpression::cmGeneratorExpression
                ((cmGeneratorExpression *)local_208,(cmListFileBacktrace *)local_190);
      pcVar4 = (this->Internal).Pointer;
      std::
      for_each<__gnu_cxx::__normal_iterator<cmTargetInternals::TargetPropertyEntry*const*,std::vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>>,ContainerAlgorithms::DefaultDeleter<std::vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>,false>>
                ((pcVar4->CompileOptionsEntries).
                 super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (pcVar4->CompileOptionsEntries).
                 super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      ppTVar5 = (pcVar4->CompileOptionsEntries).
                super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((pcVar4->CompileOptionsEntries).
          super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppTVar5) {
        (pcVar4->CompileOptionsEntries).
        super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppTVar5;
      }
      cmGeneratorExpression::Parse(&local_210,local_208);
      local_1d8._M_dataplus._M_p = (pointer)local_210.Backtrace;
      local_210.Backtrace = (cmListFileBacktrace *)0x0;
      cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                ((auto_ptr<cmCompiledGeneratorExpression> *)&local_210);
      pcVar4 = (this->Internal).Pointer;
      local_210.Backtrace = (cmListFileBacktrace *)operator_new(0x10);
      _Var6._M_p = local_1d8._M_dataplus._M_p;
      local_1d8._M_dataplus._M_p = (pointer)0x0;
      local_1a0.x_ = (cmCompiledGeneratorExpression *)0x0;
      (((cmCompiledGeneratorExpression *)local_210.Backtrace)->Backtrace).
      super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
      super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)_Var6._M_p;
      (((cmCompiledGeneratorExpression *)local_210.Backtrace)->Backtrace).
      super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
      super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)&cmTargetInternals::TargetPropertyEntry::NoLinkImplItem;
      iVar3._M_current =
           (pcVar4->CompileOptionsEntries).
           super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (pcVar4->CompileOptionsEntries).
          super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
        ::_M_realloc_insert<cmTargetInternals::TargetPropertyEntry*>
                  ((vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
                    *)&pcVar4->CompileOptionsEntries,iVar3,(TargetPropertyEntry **)&local_210);
      }
      else {
        *iVar3._M_current = (TargetPropertyEntry *)local_210.Backtrace;
        pppTVar1 = &(pcVar4->CompileOptionsEntries).
                    super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar1 = *pppTVar1 + 1;
      }
      this_00 = &local_1a0;
    }
    else {
      iVar8 = std::__cxx11::string::compare((char *)prop);
      if (iVar8 == 0) {
        cmMakefile::GetBacktrace((cmListFileBacktrace *)local_190,this->Makefile);
        cmGeneratorExpression::cmGeneratorExpression
                  ((cmGeneratorExpression *)local_208,(cmListFileBacktrace *)local_190);
        pcVar4 = (this->Internal).Pointer;
        std::
        for_each<__gnu_cxx::__normal_iterator<cmTargetInternals::TargetPropertyEntry*const*,std::vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>>,ContainerAlgorithms::DefaultDeleter<std::vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>,false>>
                  ((pcVar4->CompileFeaturesEntries).
                   super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (pcVar4->CompileFeaturesEntries).
                   super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        ppTVar5 = (pcVar4->CompileFeaturesEntries).
                  super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((pcVar4->CompileFeaturesEntries).
            super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
            ._M_impl.super__Vector_impl_data._M_finish != ppTVar5) {
          (pcVar4->CompileFeaturesEntries).
          super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppTVar5;
        }
        cmGeneratorExpression::Parse(&local_210,local_208);
        local_1d8._M_dataplus._M_p = (pointer)local_210.Backtrace;
        local_210.Backtrace = (cmListFileBacktrace *)0x0;
        cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                  ((auto_ptr<cmCompiledGeneratorExpression> *)&local_210);
        pcVar4 = (this->Internal).Pointer;
        local_210.Backtrace = (cmListFileBacktrace *)operator_new(0x10);
        _Var6._M_p = local_1d8._M_dataplus._M_p;
        local_1d8._M_dataplus._M_p = (pointer)0x0;
        local_1a8.x_ = (cmCompiledGeneratorExpression *)0x0;
        (((cmCompiledGeneratorExpression *)local_210.Backtrace)->Backtrace).
        super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
        super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)_Var6._M_p;
        (((cmCompiledGeneratorExpression *)local_210.Backtrace)->Backtrace).
        super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
        super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)&cmTargetInternals::TargetPropertyEntry::NoLinkImplItem;
        iVar3._M_current =
             (pcVar4->CompileFeaturesEntries).
             super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (pcVar4->CompileFeaturesEntries).
            super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
          ::_M_realloc_insert<cmTargetInternals::TargetPropertyEntry*>
                    ((vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
                      *)&pcVar4->CompileFeaturesEntries,iVar3,(TargetPropertyEntry **)&local_210);
        }
        else {
          *iVar3._M_current = (TargetPropertyEntry *)local_210.Backtrace;
          pppTVar1 = &(pcVar4->CompileFeaturesEntries).
                      super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppTVar1 = *pppTVar1 + 1;
        }
        this_00 = &local_1a8;
      }
      else {
        iVar8 = std::__cxx11::string::compare((char *)prop);
        if (iVar8 == 0) {
          cmMakefile::GetBacktrace((cmListFileBacktrace *)local_190,this->Makefile);
          cmGeneratorExpression::cmGeneratorExpression
                    ((cmGeneratorExpression *)local_208,(cmListFileBacktrace *)local_190);
          pcVar4 = (this->Internal).Pointer;
          std::
          for_each<__gnu_cxx::__normal_iterator<cmTargetInternals::TargetPropertyEntry*const*,std::vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>>,ContainerAlgorithms::DefaultDeleter<std::vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>,false>>
                    ((pcVar4->CompileDefinitionsEntries).
                     super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (pcVar4->CompileDefinitionsEntries).
                     super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          ppTVar5 = (pcVar4->CompileDefinitionsEntries).
                    super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((pcVar4->CompileDefinitionsEntries).
              super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
              ._M_impl.super__Vector_impl_data._M_finish != ppTVar5) {
            (pcVar4->CompileDefinitionsEntries).
            super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
            ._M_impl.super__Vector_impl_data._M_finish = ppTVar5;
          }
          cmGeneratorExpression::Parse(&local_210,local_208);
          local_1d8._M_dataplus._M_p = (pointer)local_210.Backtrace;
          local_210.Backtrace = (cmListFileBacktrace *)0x0;
          cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                    ((auto_ptr<cmCompiledGeneratorExpression> *)&local_210);
          pcVar4 = (this->Internal).Pointer;
          local_210.Backtrace = (cmListFileBacktrace *)operator_new(0x10);
          _Var6._M_p = local_1d8._M_dataplus._M_p;
          local_1d8._M_dataplus._M_p = (pointer)0x0;
          local_1b0.x_ = (cmCompiledGeneratorExpression *)0x0;
          (((cmCompiledGeneratorExpression *)local_210.Backtrace)->Backtrace).
          super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
          super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)_Var6._M_p;
          (((cmCompiledGeneratorExpression *)local_210.Backtrace)->Backtrace).
          super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
          super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)&cmTargetInternals::TargetPropertyEntry::NoLinkImplItem;
          iVar3._M_current =
               (pcVar4->CompileDefinitionsEntries).
               super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (pcVar4->CompileDefinitionsEntries).
              super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
            ::_M_realloc_insert<cmTargetInternals::TargetPropertyEntry*>
                      ((vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
                        *)&pcVar4->CompileDefinitionsEntries,iVar3,
                       (TargetPropertyEntry **)&local_210);
          }
          else {
            *iVar3._M_current = (TargetPropertyEntry *)local_210.Backtrace;
            pppTVar1 = &(pcVar4->CompileDefinitionsEntries).
                        super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppTVar1 = *pppTVar1 + 1;
          }
          this_00 = &local_1b0;
        }
        else {
          iVar8 = std::__cxx11::string::compare((char *)prop);
          if ((iVar8 == 0) && (this->IsImportedTarget == true)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_190,
                       "EXPORT_NAME property can\'t be set on imported targets (\"",0x38);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_190,(this->Name)._M_dataplus._M_p,
                                (this->Name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\")\n",3);
            pcVar2 = this->Makefile;
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_208);
            goto LAB_0035bfec;
          }
          iVar8 = std::__cxx11::string::compare((char *)prop);
          if (iVar8 == 0) {
            pcVar4 = (this->Internal).Pointer;
            std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::_M_erase_at_end
                      (&pcVar4->LinkImplementationPropertyEntries,
                       (pcVar4->LinkImplementationPropertyEntries).
                       super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>.
                       _M_impl.super__Vector_impl_data._M_start);
            cmMakefile::GetBacktrace((cmListFileBacktrace *)local_208,this->Makefile);
            std::__cxx11::string::string((string *)(local_1f8 + 0x20),value,(allocator *)&local_210)
            ;
            cmValueWithOrigin::cmValueWithOrigin
                      ((cmValueWithOrigin *)local_190,(string *)(local_1f8 + 0x20),
                       (cmListFileBacktrace *)local_208);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
              operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1
                             );
            }
            std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::push_back
                      (&((this->Internal).Pointer)->LinkImplementationPropertyEntries,
                       (value_type *)local_190);
            cmValueWithOrigin::~cmValueWithOrigin((cmValueWithOrigin *)local_190);
            this_01 = (vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)local_208;
            goto LAB_0035c51a;
          }
          iVar8 = std::__cxx11::string::compare((char *)prop);
          if (iVar8 != 0) {
            cmPropertyMap::SetProperty(&this->Properties,prop,value);
            MaybeInvalidatePropertyCache(this,prop);
            return;
          }
          if (this->IsImportedTarget == true) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_190,"SOURCES property can\'t be set on imported targets (\""
                       ,0x34);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_190,(this->Name)._M_dataplus._M_p,
                                (this->Name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\")\n",3);
            pcVar2 = this->Makefile;
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_208);
            goto LAB_0035bfec;
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
          ::clear(&(((this->Internal).Pointer)->SourceFilesMap)._M_t);
          cmMakefile::GetBacktrace((cmListFileBacktrace *)local_190,this->Makefile);
          cmGeneratorExpression::cmGeneratorExpression
                    ((cmGeneratorExpression *)local_208,(cmListFileBacktrace *)local_190);
          pcVar4 = (this->Internal).Pointer;
          ppTVar5 = (pcVar4->SourceEntries).
                    super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((pcVar4->SourceEntries).
              super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
              ._M_impl.super__Vector_impl_data._M_finish != ppTVar5) {
            (pcVar4->SourceEntries).
            super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
            ._M_impl.super__Vector_impl_data._M_finish = ppTVar5;
          }
          cmGeneratorExpression::Parse(&local_210,local_208);
          local_1d8._M_dataplus._M_p = (pointer)local_210.Backtrace;
          local_210.Backtrace = (cmListFileBacktrace *)0x0;
          cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                    ((auto_ptr<cmCompiledGeneratorExpression> *)&local_210);
          pcVar4 = (this->Internal).Pointer;
          local_210.Backtrace = (cmListFileBacktrace *)operator_new(0x10);
          _Var6._M_p = local_1d8._M_dataplus._M_p;
          local_1d8._M_dataplus._M_p = (pointer)0x0;
          local_1b8.x_ = (cmCompiledGeneratorExpression *)0x0;
          (((cmCompiledGeneratorExpression *)local_210.Backtrace)->Backtrace).
          super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
          super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)_Var6._M_p;
          (((cmCompiledGeneratorExpression *)local_210.Backtrace)->Backtrace).
          super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
          super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)&cmTargetInternals::TargetPropertyEntry::NoLinkImplItem;
          std::
          vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
          ::push_back(&pcVar4->SourceEntries,(value_type *)&local_210);
          this_00 = &local_1b8;
        }
      }
    }
  }
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(this_00);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)(local_1f8 + 0x20));
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_208);
  this_01 = (vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)local_190;
LAB_0035c51a:
  std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector(this_01);
  return;
}

Assistant:

void cmTarget::SetProperty(const std::string& prop, const char* value)
{
  if (this->GetType() == INTERFACE_LIBRARY
      && !whiteListedInterfaceProperty(prop))
    {
    std::ostringstream e;
    e << "INTERFACE_LIBRARY targets may only have whitelisted properties.  "
         "The property \"" << prop << "\" is not allowed.";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
    }
  else if (prop == "NAME")
    {
    std::ostringstream e;
    e << "NAME property is read-only\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
    }
  else if(prop == "INCLUDE_DIRECTORIES")
    {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmGeneratorExpression ge(&lfbt);
    deleteAndClear(this->Internal->IncludeDirectoriesEntries);
    cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(value);
    this->Internal->IncludeDirectoriesEntries.push_back(
                          new cmTargetInternals::TargetPropertyEntry(cge));
    }
  else if(prop == "COMPILE_OPTIONS")
    {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmGeneratorExpression ge(&lfbt);
    deleteAndClear(this->Internal->CompileOptionsEntries);
    cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(value);
    this->Internal->CompileOptionsEntries.push_back(
                          new cmTargetInternals::TargetPropertyEntry(cge));
    }
  else if(prop == "COMPILE_FEATURES")
    {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmGeneratorExpression ge(&lfbt);
    deleteAndClear(this->Internal->CompileFeaturesEntries);
    cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(value);
    this->Internal->CompileFeaturesEntries.push_back(
                          new cmTargetInternals::TargetPropertyEntry(cge));
    }
  else if(prop == "COMPILE_DEFINITIONS")
    {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmGeneratorExpression ge(&lfbt);
    deleteAndClear(this->Internal->CompileDefinitionsEntries);
    cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(value);
    this->Internal->CompileDefinitionsEntries.push_back(
                          new cmTargetInternals::TargetPropertyEntry(cge));
    }
  else if(prop == "EXPORT_NAME" && this->IsImported())
    {
    std::ostringstream e;
    e << "EXPORT_NAME property can't be set on imported targets (\""
          << this->Name << "\")\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    }
  else if (prop == "LINK_LIBRARIES")
    {
    this->Internal->LinkImplementationPropertyEntries.clear();
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmValueWithOrigin entry(value, lfbt);
    this->Internal->LinkImplementationPropertyEntries.push_back(entry);
    }
  else if (prop == "SOURCES")
    {
    if(this->IsImported())
      {
      std::ostringstream e;
      e << "SOURCES property can't be set on imported targets (\""
            << this->Name << "\")\n";
      this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
      return;
      }
    this->Internal->SourceFilesMap.clear();
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmGeneratorExpression ge(&lfbt);
    this->Internal->SourceEntries.clear();
    cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(value);
    this->Internal->SourceEntries.push_back(
                          new cmTargetInternals::TargetPropertyEntry(cge));
    }
  else
    {
    this->Properties.SetProperty(prop, value);
    this->MaybeInvalidatePropertyCache(prop);
    }
}